

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void setJoinExpr(Expr *p,int iTable)

{
  undefined4 in_ESI;
  char *in_RDI;
  int i;
  int in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  char *local_8;
  
  for (local_8 = in_RDI; local_8 != (char *)0x0; local_8 = *(char **)(local_8 + 0x18)) {
    *(uint *)(local_8 + 4) = *(uint *)(local_8 + 4) | 1;
    *(short *)(local_8 + 0x34) = (short)in_ESI;
    if ((*local_8 == -99) && (*(long *)(local_8 + 0x20) != 0)) {
      for (in_stack_fffffffffffffff0 = 0; in_stack_fffffffffffffff0 < **(int **)(local_8 + 0x20);
          in_stack_fffffffffffffff0 = in_stack_fffffffffffffff0 + 1) {
        setJoinExpr((Expr *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
      }
    }
    setJoinExpr((Expr *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  }
  return;
}

Assistant:

static void setJoinExpr(Expr *p, int iTable){
  while( p ){
    ExprSetProperty(p, EP_FromJoin);
    assert( !ExprHasProperty(p, EP_TokenOnly|EP_Reduced) );
    ExprSetVVAProperty(p, EP_NoReduce);
    p->iRightJoinTable = (i16)iTable;
    if( p->op==TK_FUNCTION && p->x.pList ){
      int i;
      for(i=0; i<p->x.pList->nExpr; i++){
        setJoinExpr(p->x.pList->a[i].pExpr, iTable);
      }
    }
    setJoinExpr(p->pLeft, iTable);
    p = p->pRight;
  } 
}